

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::App::App(App *this,string_view appName,string *configString)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  undefined8 *in_RDI;
  FederateInfo fedInfo;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_fffffffffffffdd0;
  FederateInfo *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  FederateInfo *in_stack_fffffffffffffe60;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_fffffffffffffe68;
  App *in_stack_fffffffffffffe70;
  string_view in_stack_fffffffffffffe78;
  App *in_stack_fffffffffffffe88;
  FederateInfo *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  helicsCLI11App *in_stack_fffffffffffffeb0;
  
  *in_RDI = &PTR__App_009be658;
  CLI::std::shared_ptr<helics::CombinationFederate>::shared_ptr
            ((shared_ptr<helics::CombinationFederate> *)0x248f10);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[3] = TVar1.internalTimeCode;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 4);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x81) = 0;
  *(undefined1 *)((long)in_RDI + 0x82) = 0;
  *(undefined1 *)((long)in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x248f8b);
  generateParser((App *)fedInfo.super_CoreFederateInfo.timeProps.
                        super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FederateInfo::FederateInfo(in_stack_fffffffffffffe60);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            (in_stack_fffffffffffffdd0);
  FederateInfo::injectParser(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  this_00 = (FederateInfo *)&stack0xffffffffffffffd8;
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x248fd9);
  helicsCLI11App::helics_parse<std::__cxx11::string_const&>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  processArgs(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe78);
  FederateInfo::~FederateInfo(this_00);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_01);
  return;
}

Assistant:

App::App(std::string_view appName, const std::string& configString)
{
    auto app = generateParser();
    FederateInfo fedInfo;
    fedInfo.injectParser(app.get());
    app->helics_parse(configString);
    processArgs(app, fedInfo, appName);
}